

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O2

void __thiscall iDynTree::MatrixDynSize::MatrixDynSize(MatrixDynSize *this,MatrixDynSize *other)

{
  size_t sVar1;
  size_t sVar2;
  double *__dest;
  ulong uVar3;
  
  this->_vptr_MatrixDynSize = (_func_int **)&PTR__MatrixDynSize_00237c78;
  sVar1 = other->m_rows;
  this->m_rows = sVar1;
  sVar2 = other->m_cols;
  this->m_cols = sVar2;
  uVar3 = sVar2 * sVar1;
  this->m_capacity = uVar3;
  if (uVar3 != 0) {
    __dest = (double *)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
    this->m_data = __dest;
    memcpy(__dest,other->m_data,uVar3 * 8);
    return;
  }
  this->m_data = (double *)0x0;
  return;
}

Assistant:

MatrixDynSize::MatrixDynSize(const MatrixDynSize& other)
: m_rows(other.m_rows)
, m_cols(other.m_cols)
, m_capacity(other.m_rows * other.m_cols)
{
    if (this->m_capacity == 0)
    {
        this->m_data = 0;
        return;
    }

    this->m_data = new double[this->m_capacity];
    std::memcpy(this->m_data, other.m_data, m_capacity * sizeof(double));
}